

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecPat.c
# Opt level: O2

int Cec_ManPatCollectTry(Vec_Ptr_t *vInfo,Vec_Ptr_t *vPres,int iBit,int *pLits,int nLits)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  void *pvVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  
  lVar9 = (long)(iBit >> 5);
  uVar8 = iBit & 0x1f;
  uVar3 = 1 << (sbyte)uVar8;
  uVar10 = 0;
  uVar11 = (ulong)(uint)nLits;
  if (nLits < 1) {
    uVar11 = uVar10;
  }
  while( true ) {
    if (uVar11 == uVar10) {
      for (uVar10 = 0; uVar11 != uVar10; uVar10 = uVar10 + 1) {
        iVar4 = Abc_Lit2Var(pLits[uVar10]);
        pvVar6 = Vec_PtrEntry(vInfo,iVar4);
        iVar4 = Abc_Lit2Var(pLits[uVar10]);
        pvVar7 = Vec_PtrEntry(vPres,iVar4);
        puVar1 = (uint *)((long)pvVar7 + lVar9 * 4);
        *puVar1 = *puVar1 | uVar3;
        uVar2 = *(uint *)((long)pvVar6 + lVar9 * 4);
        uVar5 = Abc_LitIsCompl(pLits[uVar10]);
        if (((uVar2 >> uVar8 & 1) != 0) == uVar5) {
          puVar1 = (uint *)((long)pvVar6 + lVar9 * 4);
          *puVar1 = *puVar1 ^ uVar3;
        }
      }
      return 1;
    }
    iVar4 = Abc_Lit2Var(pLits[uVar10]);
    pvVar6 = Vec_PtrEntry(vInfo,iVar4);
    iVar4 = Abc_Lit2Var(pLits[uVar10]);
    pvVar7 = Vec_PtrEntry(vPres,iVar4);
    if (((*(uint *)((long)pvVar7 + lVar9 * 4) & uVar3) != 0) &&
       (uVar2 = *(uint *)((long)pvVar6 + lVar9 * 4), uVar5 = Abc_LitIsCompl(pLits[uVar10]),
       ((uVar2 >> uVar8 & 1) != 0) == uVar5)) break;
    uVar10 = uVar10 + 1;
  }
  return 0;
}

Assistant:

int Cec_ManPatCollectTry( Vec_Ptr_t * vInfo, Vec_Ptr_t * vPres, int iBit, int * pLits, int nLits )
{
    unsigned * pInfo, * pPres;
    int i;
    for ( i = 0; i < nLits; i++ )
    {
        pInfo = (unsigned *)Vec_PtrEntry(vInfo, Abc_Lit2Var(pLits[i]));
        pPres = (unsigned *)Vec_PtrEntry(vPres, Abc_Lit2Var(pLits[i]));
        if ( Abc_InfoHasBit( pPres, iBit ) && 
             Abc_InfoHasBit( pInfo, iBit ) == Abc_LitIsCompl(pLits[i]) )
             return 0;
    }
    for ( i = 0; i < nLits; i++ )
    {
        pInfo = (unsigned *)Vec_PtrEntry(vInfo, Abc_Lit2Var(pLits[i]));
        pPres = (unsigned *)Vec_PtrEntry(vPres, Abc_Lit2Var(pLits[i]));
        Abc_InfoSetBit( pPres, iBit );
        if ( Abc_InfoHasBit( pInfo, iBit ) == Abc_LitIsCompl(pLits[i]) )
            Abc_InfoXorBit( pInfo, iBit );
    }
    return 1;
}